

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O0

void Aig_ManCheckPhase(Aig_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pObj_00;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_1c = 0;
  do {
    iVar2 = Vec_PtrSize(p->vObjs);
    if (iVar2 <= local_1c) {
      return;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if (pAVar5 != (Aig_Obj_t *)0x0) {
      iVar2 = Aig_ObjIsCi(pAVar5);
      if (iVar2 == 0) {
        uVar1 = *(ulong *)&pAVar5->field_0x18;
        pObj_00 = Aig_ObjChild0(pAVar5);
        uVar3 = Aig_ObjPhaseReal(pObj_00);
        pAVar5 = Aig_ObjChild1(pAVar5);
        uVar4 = Aig_ObjPhaseReal(pAVar5);
        if (((uint)(uVar1 >> 3) & 1) != (uVar3 & uVar4)) {
          __assert_fail("(int)pObj->fPhase == (Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) & Aig_ObjPhaseReal(Aig_ObjChild1(pObj)))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCheck.c"
                        ,0x9f,"void Aig_ManCheckPhase(Aig_Man_t *)");
        }
      }
      else if ((*(ulong *)&pAVar5->field_0x18 >> 3 & 1) != 0) {
        __assert_fail("(int)pObj->fPhase == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCheck.c"
                      ,0x9d,"void Aig_ManCheckPhase(Aig_Man_t *)");
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void Aig_ManCheckPhase( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsCi(pObj) )
            assert( (int)pObj->fPhase == 0 );
        else
            assert( (int)pObj->fPhase == (Aig_ObjPhaseReal(Aig_ObjChild0(pObj)) & Aig_ObjPhaseReal(Aig_ObjChild1(pObj))) );
}